

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::CreatePegoutAddressRequest::CreatePegoutAddressRequest
          (CreatePegoutAddressRequest *this)

{
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  CreatePegoutAddressRequest *local_10;
  CreatePegoutAddressRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::CreatePegoutAddressRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::CreatePegoutAddressRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::CreatePegoutAddressRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreatePegoutAddressRequest_01b4b1e8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->network_,"mainnet",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->elements_network_,"mainnet",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->descriptor_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  this->bip32_counter_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hash_type_,"p2pkh",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  CollectFieldName();
  return;
}

Assistant:

CreatePegoutAddressRequest() {
    CollectFieldName();
  }